

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O3

int64_t __thiscall llvm::APInt::srem(APInt *this,int64_t RHS)

{
  uint uVar1;
  bool bVar2;
  anon_union_8_2_1313ab2f_for_U aVar3;
  uint64_t uVar4;
  ulong uVar5;
  anon_union_8_2_1313ab2f_for_U local_50;
  uint local_48;
  anon_union_8_2_1313ab2f_for_U local_40;
  uint local_38;
  anon_union_8_2_1313ab2f_for_U local_30;
  uint local_28;
  
  bVar2 = operator[](this,this->BitWidth - 1);
  if (!bVar2) {
    if (RHS < 0) {
      RHS = -RHS;
    }
    uVar4 = urem(this,RHS);
    return uVar4;
  }
  if (RHS < 0) {
    local_38 = this->BitWidth;
    if ((ulong)local_38 < 0x41) {
      aVar3 = this->U;
    }
    else {
      uVar5 = (ulong)((uint)((ulong)local_38 + 0x3f >> 3) & 0xfffffff8);
      aVar3.pVal = (uint64_t *)operator_new__(uVar5);
      memcpy(aVar3.pVal,(this->U).pVal,uVar5);
    }
    local_40 = aVar3;
    flipAllBits((APInt *)&local_40);
    operator++((APInt *)&local_40);
    local_28 = local_38;
    local_30.VAL = local_40.VAL;
    local_38 = 0;
    uVar4 = urem((APInt *)&local_30,-RHS);
    aVar3 = local_40;
    uVar1 = local_38;
    if ((0x40 < local_28) && (local_30.VAL != 0)) {
      operator_delete__(local_30.pVal);
      aVar3 = local_40;
      uVar1 = local_38;
    }
  }
  else {
    local_48 = this->BitWidth;
    if ((ulong)local_48 < 0x41) {
      aVar3 = this->U;
    }
    else {
      uVar5 = (ulong)((uint)((ulong)local_48 + 0x3f >> 3) & 0xfffffff8);
      aVar3.pVal = (uint64_t *)operator_new__(uVar5);
      memcpy(aVar3.pVal,(this->U).pVal,uVar5);
    }
    local_50 = aVar3;
    flipAllBits((APInt *)&local_50);
    operator++((APInt *)&local_50);
    local_28 = local_48;
    local_30.VAL = local_50.VAL;
    local_48 = 0;
    uVar4 = urem((APInt *)&local_30,RHS);
    aVar3 = local_50;
    uVar1 = local_48;
    if ((0x40 < local_28) && (local_30.VAL != 0)) {
      operator_delete__(local_30.pVal);
      aVar3 = local_50;
      uVar1 = local_48;
    }
  }
  if ((0x40 < uVar1) && ((void *)aVar3.VAL != (void *)0x0)) {
    operator_delete__(aVar3.pVal);
  }
  return -uVar4;
}

Assistant:

int64_t APInt::srem(int64_t RHS) const {
  if (isNegative()) {
    if (RHS < 0)
      return -((-(*this)).urem(-RHS));
    return -((-(*this)).urem(RHS));
  }
  if (RHS < 0)
    return this->urem(-RHS);
  return this->urem(RHS);
}